

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall wallet::SQLiteCursor::~SQLiteCursor(SQLiteCursor *this)

{
  pointer pbVar1;
  int iVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__SQLiteCursor_013b9b40;
  sqlite3_clear_bindings(this->m_cursor_stmt);
  sqlite3_reset(this->m_cursor_stmt);
  iVar2 = sqlite3_finalize(this->m_cursor_stmt);
  if (iVar2 != 0) {
    local_18 = (char *)sqlite3_errstr(iVar2);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    logging_function._M_str = "~SQLiteCursor";
    logging_function._M_len = 0xd;
    LogPrintFormatInternal<char[14],char_const*>
              (logging_function,source_file,0x24e,ALL,Info,(ConstevalFormatString<2U>)0x110ea0d,
               (char (*) [14])"~SQLiteCursor",&local_18);
  }
  pbVar1 = (this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->m_prefix_range_end).
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  pbVar1 = (this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->m_prefix_range_start).
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteCursor::~SQLiteCursor()
{
    sqlite3_clear_bindings(m_cursor_stmt);
    sqlite3_reset(m_cursor_stmt);
    int res = sqlite3_finalize(m_cursor_stmt);
    if (res != SQLITE_OK) {
        LogPrintf("%s: cursor closed but could not finalize cursor statement: %s\n",
                  __func__, sqlite3_errstr(res));
    }
}